

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

void __thiscall blc::tools::pipe::waitWrite(pipe *this,int usec)

{
  byte bVar1;
  ulong uVar2;
  long *in_RDI;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_00000010;
  duration<long,std::ratio<1l,1000000l>> local_18 [12];
  int local_c [3];
  
  uVar2 = (**(code **)(*in_RDI + 0x30))();
  if ((uVar2 & 1) == 0) {
    while (bVar1 = (**(code **)(*in_RDI + 0x28))(), (bVar1 & 1) == 0) {
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_18,local_c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(in_stack_00000010);
    }
  }
  return;
}

Assistant:

void blc::tools::pipe::waitWrite(int usec) const {
	if (this->isClosed())
		return;
	while (this->writable() == false) {
		std::this_thread::sleep_for(std::chrono::microseconds(usec));
	}
}